

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.h
# Opt level: O3

void __thiscall OnDiskIndex::OnDiskIndex(OnDiskIndex *this,OnDiskIndex *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->index_size = param_1->index_size;
  paVar1 = &(this->fname).field_2;
  (this->fname)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->fname)._M_dataplus._M_p;
  paVar2 = &(param_1->fname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->fname).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fname).field_2 + 8) = uVar4;
  }
  else {
    (this->fname)._M_dataplus._M_p = pcVar3;
    (this->fname).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->fname)._M_string_length = (param_1->fname)._M_string_length;
  (param_1->fname)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->fname)._M_string_length = 0;
  (param_1->fname).field_2._M_local_buf[0] = '\0';
  std::experimental::filesystem::v1::__cxx11::path::path(&this->fpath,&param_1->fpath);
  RawFile::RawFile(&this->ndxfile,&param_1->ndxfile);
  this->ntype = param_1->ntype;
  return;
}

Assistant:

OnDiskIndex(OnDiskIndex &&) = default;